

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImNodes.cpp
# Opt level: O0

void ImNodes::EndCanvas(void)

{
  ImGuiStorage *this;
  char *pcVar1;
  void *pvVar2;
  float *pfVar3;
  bool bVar4;
  int iVar5;
  ImU32 IVar6;
  ImGuiID IVar7;
  ImDrawList *this_00;
  ImGuiContext *pIVar8;
  ImGuiWindow *pIVar9;
  float fVar10;
  float fVar11;
  bool local_f1;
  ImVec2 local_b0;
  ImVec2 local_a8;
  ImVec2 local_a0;
  ImGuiIO *local_98;
  ImGuiIO *io;
  ImGuiID local_84;
  ImVec2 IStack_80;
  ImGuiID canvas_id;
  ImVec2 local_78;
  ImVec2 local_70;
  ImVec2 output_pos;
  ImVec2 input_pos;
  ImVec2 IStack_58;
  float connection_indent;
  ImVec2 slot_pos;
  _DragConnectionPayload *drag_data;
  char data_type_fragment [21];
  ImGuiPayload *payload;
  ImGuiStyle *style;
  _CanvasStateImpl *impl;
  CanvasState *canvas;
  ImDrawList *draw_list;
  
  if (gCanvas == (float *)0x0) {
    __assert_fail("gCanvas != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/kidanger[P]vpe/ImNodes/ImNodes.cpp"
                  ,0x10b,"void ImNodes::EndCanvas()");
  }
  this_00 = ImGui::GetWindowDrawList();
  pfVar3 = gCanvas;
  this = *(ImGuiStorage **)(gCanvas + 0x26);
  ImGui::GetStyle();
  register0x00000000 = ImGui::GetDragDropPayload();
  if (register0x00000000 != (ImGuiPayload *)0x0) {
    drag_data = (_DragConnectionPayload *)0x65646f6e2d77656e;
    builtin_strncpy(data_type_fragment,"-connection-",0xd);
    iVar5 = strncmp(register0x00000000->DataType,(char *)&drag_data,0x14);
    if (iVar5 == 0) {
      slot_pos = (ImVec2)stack0xffffffffffffffd0->Data;
      pcVar1 = *(char **)((long)slot_pos + 8);
      pvVar2 = *(void **)slot_pos;
      bVar4 = IsInputSlotKind(*(int *)((long)slot_pos + 0x10));
      IVar6 = MakeSlotDataID("x",pcVar1,pvVar2,bVar4);
      fVar10 = ImGuiStorage::GetFloat(this,IVar6,0.0);
      pcVar1 = *(char **)((long)slot_pos + 8);
      pvVar2 = *(void **)slot_pos;
      bVar4 = IsInputSlotKind(*(int *)((long)slot_pos + 0x10));
      IVar6 = MakeSlotDataID("y",pcVar1,pvVar2,bVar4);
      fVar11 = ImGuiStorage::GetFloat(this,IVar6,0.0);
      ImVec2::ImVec2(&stack0xffffffffffffffa8,fVar10,fVar11);
      fVar10 = pfVar3[0x24];
      fVar11 = *pfVar3;
      ImVec2::ImVec2(&output_pos);
      ImVec2::ImVec2(&local_70);
      bVar4 = IsInputSlotKind(*(int *)((long)slot_pos + 0x10));
      if (bVar4) {
        output_pos.x = IStack_58.x;
        output_pos.y = IStack_58.y;
        output_pos.x = output_pos.x + fVar10 * fVar11;
        local_78 = ImGui::GetMousePos();
        local_70 = local_78;
      }
      else {
        IStack_80 = ImGui::GetMousePos();
        local_70.x = IStack_58.x;
        local_70.y = IStack_58.y;
        local_70.x = local_70.x - fVar10 * fVar11;
        output_pos = IStack_80;
      }
      RenderConnection(&output_pos,&local_70,pfVar3[0x23]);
    }
  }
  iVar5 = this[8].Data.Size;
  pIVar8 = ImGui::GetCurrentContext();
  if (iVar5 <= pIVar8->FrameCount) {
    this[7].Data.Data = (Pair *)0x0;
  }
  iVar5 = this[8].Data.Capacity;
  if (iVar5 == 0) {
    local_84 = ImGui::GetID("canvas");
    bVar4 = ImGui::IsMouseDown(0);
    local_f1 = false;
    if (bVar4) {
      pIVar9 = ImGui::GetCurrentWindow();
      register0x00001200 = ImGui::GetMousePos();
      local_f1 = ImRect::Contains(&pIVar9->ContentsRegionRect,(ImVec2 *)((long)&io + 4));
    }
    if (local_f1 == false) {
      IVar7 = ImGui::GetActiveID();
      if (IVar7 == local_84) {
        ImGui::ClearActiveID();
      }
    }
    else {
      bVar4 = ImGui::IsWindowHovered(0);
      if (bVar4) {
        bVar4 = ImGui::IsWindowFocused(0);
        if (!bVar4) {
          pIVar9 = ImGui::GetCurrentWindow();
          ImGui::FocusWindow(pIVar9);
        }
        bVar4 = ImGui::IsAnyItemActive();
        IVar7 = local_84;
        if (!bVar4) {
          pIVar9 = ImGui::GetCurrentWindow();
          ImGui::SetActiveID(IVar7,pIVar9);
          local_98 = ImGui::GetIO();
          if (((local_98->KeyCtrl & 1U) == 0) && ((local_98->KeyShift & 1U) == 0)) {
            this[7].Data.Data = (Pair *)0x0;
            pIVar8 = ImGui::GetCurrentContext();
            this[8].Data.Size = pIVar8->FrameCount + 1;
          }
        }
      }
      IVar7 = ImGui::GetActiveID();
      if ((IVar7 == local_84) && (bVar4 = ImGui::IsMouseDragging(0,-1.0), bVar4)) {
        local_a0 = ImGui::GetMousePos();
        *(ImVec2 *)(this + 6) = local_a0;
        this[8].Data.Capacity = 2;
      }
    }
  }
  else if (iVar5 == 1) {
    bVar4 = ImGui::IsMouseDown(0);
    if (!bVar4) {
      this[8].Data.Capacity = 0;
      this[6].Data.Data = (Pair *)0x0;
    }
  }
  else if (iVar5 == 2) {
    bVar4 = ImGui::IsMouseDown(0);
    if (bVar4) {
      local_a8 = ImGui::GetMousePos();
      IVar6 = ImColor::operator_cast_to_unsigned_int((ImColor *)(pfVar3 + 0x1b));
      ImDrawList::AddRectFilled(this_00,(ImVec2 *)(this + 6),&local_a8,IVar6,0.0,0xf);
      local_b0 = ImGui::GetMousePos();
      IVar6 = ImColor::operator_cast_to_unsigned_int((ImColor *)(pfVar3 + 0x1f));
      ImDrawList::AddRect(this_00,(ImVec2 *)(this + 6),&local_b0,IVar6,0.0,0xf,1.0);
    }
    else {
      ImGui::ClearActiveID();
      this[8].Data.Capacity = 0;
    }
  }
  ImGui::SetWindowFontScale(1.0);
  ImGui::PopID();
  gCanvas._0_4_ = this[9].Data.Size;
  gCanvas._4_4_ = this[9].Data.Capacity;
  return;
}

Assistant:

void EndCanvas()
{
    assert(gCanvas != nullptr);     // Did you forget calling BeginCanvas()?

    ImDrawList* draw_list = ImGui::GetWindowDrawList();
    auto* canvas = gCanvas;
    auto* impl = canvas->_impl;
    const ImGuiStyle& style = ImGui::GetStyle();

    // Draw pending connection
    if (const ImGuiPayload* payload = ImGui::GetDragDropPayload())
    {
        char data_type_fragment[] = "new-node-connection-";
        if (strncmp(payload->DataType, data_type_fragment, sizeof(data_type_fragment) - 1) == 0)
        {
            auto* drag_data = (_DragConnectionPayload*)payload->Data;
            ImVec2 slot_pos{
                impl->cached_data.GetFloat(MakeSlotDataID("x", drag_data->slot_title, drag_data->node_id,
                    IsInputSlotKind(drag_data->slot_kind))),
                impl->cached_data.GetFloat(MakeSlotDataID("y", drag_data->slot_title, drag_data->node_id,
                    IsInputSlotKind(drag_data->slot_kind))),
            };

            float connection_indent = canvas->style.connection_indent * canvas->zoom;

            ImVec2 input_pos, output_pos;
            if (IsInputSlotKind(drag_data->slot_kind))
            {
                input_pos = slot_pos;
                input_pos.x += connection_indent;
                output_pos = ImGui::GetMousePos();
            }
            else
            {
                input_pos = ImGui::GetMousePos();
                output_pos = slot_pos;
                output_pos.x -= connection_indent;
            }

            RenderConnection(input_pos, output_pos, canvas->style.curve_thickness);
        }
    }

    if (impl->do_selections_frame <= ImGui::GetCurrentContext()->FrameCount)
        impl->single_selected_node = nullptr;

    switch (impl->state)
    {
    case State_None:
    {
        ImGuiID canvas_id = ImGui::GetID("canvas");
        if (ImGui::IsMouseDown(0) && ImGui::GetCurrentWindow()->ContentsRegionRect.Contains(ImGui::GetMousePos()))
        {
            if (ImGui::IsWindowHovered())
            {
                if (!ImGui::IsWindowFocused())
                    ImGui::FocusWindow(ImGui::GetCurrentWindow());

                if (!ImGui::IsAnyItemActive())
                {
                    ImGui::SetActiveID(canvas_id, ImGui::GetCurrentWindow());
                    const ImGuiIO& io = ImGui::GetIO();
                    if (!io.KeyCtrl && !io.KeyShift)
                    {
                        impl->single_selected_node = nullptr;   // unselect all
                        impl->do_selections_frame = ImGui::GetCurrentContext()->FrameCount + 1;
                    }
                }
            }

            if (ImGui::GetActiveID() == canvas_id && ImGui::IsMouseDragging(0))
            {
                impl->selection_start = ImGui::GetMousePos();
                impl->state = State_Select;
            }
        }
        else if (ImGui::GetActiveID() == canvas_id)
            ImGui::ClearActiveID();
        break;
    }
    case State_Drag:
    {
        if (!ImGui::IsMouseDown(0))
        {
            impl->state = State_None;
            impl->drag_node = nullptr;
        }
        break;
    }
    case State_Select:
    {
        if (ImGui::IsMouseDown(0))
        {
            draw_list->AddRectFilled(impl->selection_start, ImGui::GetMousePos(), canvas->colors[ColSelectBg]);
            draw_list->AddRect(impl->selection_start, ImGui::GetMousePos(), canvas->colors[ColSelectBorder]);
        }
        else
        {
            ImGui::ClearActiveID();
            impl->state = State_None;
        }
        break;
    }
    }

    ImGui::SetWindowFontScale(1.f);
    ImGui::PopID();     // canvas
    gCanvas = impl->prev_canvas;
}